

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  int *piVar1;
  int iVar2;
  ImGuiPopupData *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiPopupData *__dest;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  int iVar7;
  
  pIVar4 = GImGui;
  if ((GImGui->DebugLogFlags & 4) != 0) {
    DebugLog("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n",
             (ulong)(uint)remaining,restore_focus_to_window_under_popup);
  }
  pIVar3 = (pIVar4->OpenPopupStack).Data;
  pIVar5 = pIVar3[remaining].Window;
  pIVar6 = pIVar3[remaining].BackupNavWindow;
  iVar2 = (pIVar4->OpenPopupStack).Capacity;
  if (iVar2 < remaining) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= remaining) {
      iVar7 = remaining;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((long)iVar7 * 0x38,GImAllocatorUserData);
      pIVar3 = (pIVar4->OpenPopupStack).Data;
      if (pIVar3 != (ImGuiPopupData *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar4->OpenPopupStack).Size * 0x38);
        pIVar3 = (pIVar4->OpenPopupStack).Data;
        if ((pIVar3 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar4->OpenPopupStack).Data = __dest;
      (pIVar4->OpenPopupStack).Capacity = iVar7;
    }
  }
  (pIVar4->OpenPopupStack).Size = remaining;
  if (restore_focus_to_window_under_popup) {
    if ((pIVar5 != (ImGuiWindow *)0x0) && ((pIVar5->Flags & 0x10000000) != 0)) {
      pIVar6 = pIVar5->ParentWindow;
    }
    if (((pIVar6 != (ImGuiWindow *)0x0) && (pIVar5 != (ImGuiWindow *)0x0)) &&
       (pIVar6->WasActive == false)) {
      FocusTopMostWindowUnderOne(pIVar5,(ImGuiWindow *)0x0);
      return;
    }
    if (((pIVar6 == (ImGuiWindow *)0x0) || (pIVar4->NavLayer != ImGuiNavLayer_Main)) ||
       ((pIVar5 = pIVar6->NavLastChildNavWindow, pIVar5 == (ImGuiWindow *)0x0 ||
        (pIVar5->WasActive == false)))) {
      pIVar5 = pIVar6;
    }
    FocusWindow(pIVar5);
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    ImGuiWindow* popup_backup_nav_window = g.OpenPopupStack[remaining].BackupNavWindow;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        ImGuiWindow* focus_window = (popup_window && popup_window->Flags & ImGuiWindowFlags_ChildMenu) ? popup_window->ParentWindow : popup_backup_nav_window;
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}